

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O0

double * __thiscall TPZMatrix<double>::operator()(TPZMatrix<double> *this,int64_t row,int64_t col)

{
  int iVar1;
  int64_t iVar2;
  undefined4 extraout_var;
  long in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  if (in_RSI < iVar2) {
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    if (((in_RDX < iVar2) && (-1 < in_RSI)) && (-1 < in_RDX)) goto LAB_012d561e;
  }
  Error(in_stack_000001d0,in_stack_000001c8);
  pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
LAB_012d561e:
  iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x22])(in_RDI,in_RSI,in_RDX);
  return (double *)CONCAT44(extraout_var,iVar1);
}

Assistant:

inline TVar &TPZMatrix<TVar>::operator()(const int64_t row, const int64_t col) {
	// bound checking
#ifndef PZNODEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col<0 ) {
		Error("TPZMatrix<TVar>::Operator()","Index out of range");
        DebugStop();
	}
#endif
	return s(row,col);
}